

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symul.cpp
# Opt level: O3

void __thiscall
symul::symul(symul *this,int *n,float *r,vec2f *boxS,vec2f *iniBox,float speed,float time)

{
  mt19937 *this_00;
  float fVar1;
  pointer ppVar2;
  ulong uVar3;
  long lVar4;
  result_type rVar5;
  result_type rVar6;
  long lVar7;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  allocator_type local_7d;
  float local_7c;
  float local_78;
  float local_74;
  floatingType local_70;
  float local_6c;
  int *local_68;
  vec2f *local_60;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_68 = n;
  local_60 = iniBox;
  local_58 = speed;
  uStack_54 = in_XMM0_Db;
  uStack_50 = in_XMM0_Dc;
  uStack_4c = in_XMM0_Dd;
  std::vector<particle,_std::allocator<particle>_>::vector(&this->particles,(long)*n,&local_7d);
  this_00 = &this->mt_rand;
  uVar3 = ::time((time_t *)0x0);
  uVar3 = uVar3 & 0xffffffff;
  (this->mt_rand)._M_x[0] = uVar3;
  lVar4 = 4;
  do {
    uVar3 = (ulong)((((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4) - 3);
    (this->mt_rand)._M_x[lVar4 + -3] = uVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x273);
  (this->mt_rand)._M_p = 0x270;
  this->box = *boxS;
  this->particleR = *r;
  this->timeTick = time;
  if (0 < *local_68) {
    local_48 = -local_58;
    uStack_44 = uStack_54 ^ 0x80000000;
    uStack_40 = uStack_50 ^ 0x80000000;
    uStack_3c = uStack_4c ^ 0x80000000;
    local_58 = local_58 + local_58;
    lVar4 = 0xc;
    lVar7 = 0;
    do {
      local_6c = *r;
      fVar1 = local_60->x;
      rVar5 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      local_78 = (float)rVar5 * 2.3283064e-10;
      local_74 = *r;
      local_70 = local_60->y;
      rVar5 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      local_7c = (float)rVar5 * 2.3283064e-10;
      rVar5 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      rVar6 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      ppVar2 = (this->particles).super__Vector_base<particle,_std::allocator<particle>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(float *)((long)ppVar2 + lVar4 + -0xc) =
           ((fVar1 - local_6c) - (local_6c + 0.0)) * local_78 + local_6c + 0.0;
      *(float *)((long)ppVar2 + lVar4 + -8) =
           ((local_70 - local_74) - (local_74 + 0.0)) * local_7c + local_74 + 0.0;
      *(float *)((long)ppVar2 + lVar4 + -4) = (float)rVar5 * 2.3283064e-10 * local_58 + local_48;
      *(float *)((long)&(ppVar2->position).x + lVar4) =
           (float)rVar6 * 2.3283064e-10 * local_58 + local_48;
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar7 < *local_68);
  }
  return;
}

Assistant:

symul::symul(const int& n, const float& r, const vec2f& boxS, const vec2f& iniBox, float speed, float time)
    : particleR(r), box(boxS), particles(n), timeTick(time), mt_rand(std::time(0))
{
    auto randFloat = [&](float low, float high)
    {
        return low + (high - low) * (static_cast<float>(mt_rand() - mt_rand.min()) / static_cast<float>(mt_rand.max()));
    };
    for(int i = 0; i < n; i++)
        particles[i] = particle(vec2f(randFloat(0 + r, iniBox.getX() - r), randFloat(0 + r, iniBox.getY() - r)),
                                vec2f(randFloat(-speed, speed), randFloat(-speed, speed)));
}